

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
mxx::impl::
sample_block_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,impl *this,long begin,
          int param_4,long param_5,undefined8 param_6)

{
  impl *piVar1;
  int iVar2;
  pointer piVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  undefined8 uVar8;
  ulong uVar9;
  size_type_conflict sVar10;
  size_type_conflict __new_size;
  ulong uVar11;
  allocator_type local_59;
  long local_58;
  undefined8 local_50;
  int rank;
  undefined4 uStack_44;
  pointer local_40;
  
  local_50 = param_6;
  if (begin - (long)this == 0) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)(uint)rank,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
           ,0xa9,"sample_block_decomp","local_size > 0");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  iVar2 = *(int *)(param_5 + 0x10);
  sVar10 = (size_type_conflict)param_4;
  local_58 = param_5;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,sVar10,(allocator_type *)&rank);
  uVar8 = local_50;
  lVar6 = local_58;
  piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar3;
  if (lVar5 != 0) {
    uVar11 = begin - (long)this >> 2;
    lVar5 = lVar5 >> 2;
    uVar9 = 0;
    do {
      piVar1 = this + ((uVar11 / (ulong)(long)(param_4 + 1) - 1) +
                      (ulong)(uVar9 < uVar11 % (ulong)(long)(param_4 + 1))) * 4;
      this = piVar1 + 4;
      piVar3[uVar9] = *(int *)piVar1;
      uVar9 = uVar9 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != uVar9);
  }
  if (*(int *)(local_58 + 0x14) == 0) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&rank,(long)(iVar2 * param_4),&local_59);
    uVar8 = local_50;
    MPI_Gather((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,param_4,local_50,CONCAT44(uStack_44,rank),param_4,
               local_50,0,*(undefined8 *)(local_58 + 8));
    piVar3 = (pointer)CONCAT44(uStack_44,rank);
    if (piVar3 != local_40) {
      uVar9 = (long)local_40 - (long)piVar3 >> 2;
      lVar6 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                (piVar3,local_40,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                (piVar3);
    }
    __new_size = (long)iVar2 - 1;
    if ((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2 != __new_size) {
      std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,__new_size);
    }
    pvVar4 = (void *)CONCAT44(uStack_44,rank);
    piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar3;
    if (lVar6 != 0) {
      lVar6 = lVar6 >> 2;
      piVar7 = (int *)((long)pvVar4 + sVar10 * 4 + -4);
      lVar5 = 0;
      do {
        piVar3[lVar5] = *piVar7;
        lVar5 = lVar5 + 1;
        piVar7 = piVar7 + sVar10;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar5);
    }
    lVar6 = local_58;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4);
      lVar6 = local_58;
    }
  }
  else {
    MPI_Gather(piVar3,param_4,local_50,0,0,local_50,0,*(undefined8 *)(local_58 + 8));
    sVar10 = (long)iVar2 - 1;
    if ((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2 != sVar10) {
      std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,sVar10);
    }
  }
  piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  MPI_Bcast(piVar3,(ulong)((long)(__return_storage_ptr__->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar3) >> 2,uVar8,0,
            *(undefined8 *)(lVar6 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_block_decomp(_Iterator begin, _Iterator end, _Compare comp, int s, const mxx::comm& comm, MPI_Datatype mpi_dt)
{
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    std::size_t local_size = std::distance(begin, end);
    MXX_ASSERT(local_size > 0);
    int p = comm.size();

    // 1. samples
    //  - pick `s` samples equally spaced such that `s` samples define `s+1`
    //    subsequences in the sorted order
    std::vector<value_type> local_splitters(s);
    _Iterator pos = begin;
    for (std::size_t i = 0; i < local_splitters.size(); ++i) {
        std::size_t bucket_size = local_size / (s+1) + (i < (local_size % (s+1)) ? 1 : 0);
        // pick last element of each bucket
        pos += (bucket_size-1);
        local_splitters[i] = *pos;
        ++pos;
    }

    // 2. gather samples to `rank = 0`
    // - TODO: rather call sample sort
    //         recursively and implement a base case for samplesort which does
    //         gather to rank=0, local sort and redistribute
    if (comm.rank() == 0) {
        std::vector<value_type> all_samples(p*s);
        MPI_Gather(&local_splitters[0], s, mpi_dt,
                   &all_samples[0], s, mpi_dt, 0, comm);

        // 3. local sort on master
        std::sort(all_samples.begin(), all_samples.end(), comp);

        // 4. pick p-1 splitters and broadcast them
        if (local_splitters.size() != (size_t) p-1) {
            local_splitters.resize(p-1);
        }
        // split into `p` pieces and choose the `p-1` splitting elements
        _Iterator pos = all_samples.begin();
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = (p*s) / p + (i < static_cast<std::size_t>((p*s) % p) ? 1 : 0);
            // pick last element of each bucket
            local_splitters[i] = *(pos + (bucket_size-1));
            pos += bucket_size;
        }
    }
    else
    {
        // simply send
        MPI_Gather(&local_splitters[0], s, mpi_dt, NULL, 0, mpi_dt, 0, comm);

        // resize splitters for receiving
        if (local_splitters.size() != (size_t) p-1) {
            local_splitters.resize(p-1);
        }
    }

    // 4. broadcast and receive final splitters
    MPI_Bcast(&local_splitters[0], local_splitters.size(), mpi_dt, 0, comm);

    return local_splitters;
}